

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::Mutex::LockSlowWithDeadline
          (Mutex *this,MuHow how,Condition *cond,KernelTimeout t,int flags)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  PerThreadSynch *thread_arg;
  bool local_221;
  undefined1 local_d0 [8];
  SynchWaitParams waitp;
  bool unlock;
  intptr_t v;
  int flags_local;
  Condition *cond_local;
  MuHow how_local;
  Mutex *this_local;
  KernelTimeout t_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  waitp._63_1_ = 0;
  if ((uVar1 & how->fast_need_zero) == 0) {
    uVar2 = how->fast_or;
    uVar4 = ClearDesignatedWakerMask(flags & 1);
    LOCK();
    bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i = (uVar2 | uVar1 & uVar4) + how->fast_add;
    }
    UNLOCK();
    if (bVar3) {
      if ((cond == (Condition *)0x0) ||
         (bVar3 = EvalConditionAnnotated(cond,this,true,false,how == (MuHow)kSharedS), bVar3)) {
        return true;
      }
      waitp._63_1_ = 1;
    }
  }
  thread_arg = Synch_GetPerThreadAnnotated(this);
  SynchWaitParams::SynchWaitParams
            ((SynchWaitParams *)local_d0,how,cond,t,(Mutex *)0x0,thread_arg,(atomic<long> *)0x0);
  v._4_4_ = flags;
  if (cond != (Condition *)0x0) {
    v._4_4_ = flags | 2;
  }
  if ((waitp._63_1_ & 1) != 0) {
    UnlockSlow(this,(SynchWaitParams *)local_d0);
    Block(this,(PerThreadSynch *)waitp.cvmu);
    v._4_4_ = v._4_4_ | 1;
  }
  LockSlowLoop(this,(SynchWaitParams *)local_d0,v._4_4_);
  local_221 = true;
  if ((waitp.how == (MuHow)0x0) && (local_221 = true, cond != (Condition *)0x0)) {
    local_221 = EvalConditionAnnotated(cond,this,true,false,how == (MuHow)kSharedS);
  }
  return local_221;
}

Assistant:

bool Mutex::LockSlowWithDeadline(MuHow how, const Condition* cond,
                                 KernelTimeout t, int flags) {
  intptr_t v = mu_.load(std::memory_order_relaxed);
  bool unlock = false;
  if ((v & how->fast_need_zero) == 0 &&  // try fast acquire
      mu_.compare_exchange_strong(
          v,
          (how->fast_or |
           (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
              how->fast_add,
          std::memory_order_acquire, std::memory_order_relaxed)) {
    if (cond == nullptr ||
        EvalConditionAnnotated(cond, this, true, false, how == kShared)) {
      return true;
    }
    unlock = true;
  }
  SynchWaitParams waitp(how, cond, t, nullptr /*no cvmu*/,
                        Synch_GetPerThreadAnnotated(this),
                        nullptr /*no cv_word*/);
  if (cond != nullptr) {
    flags |= kMuIsCond;
  }
  if (unlock) {
    this->UnlockSlow(&waitp);
    this->Block(waitp.thread);
    flags |= kMuHasBlocked;
  }
  this->LockSlowLoop(&waitp, flags);
  return waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
         cond == nullptr ||
         EvalConditionAnnotated(cond, this, true, false, how == kShared);
}